

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRS.h
# Opt level: O0

char * FindRazorAHRSSentence(char *sentencebegin,char *str)

{
  size_t sVar1;
  char *pcVar2;
  char *foundstr;
  char *ptr;
  char *str_local;
  char *sentencebegin_local;
  
  sentencebegin_local = strstr(str,sentencebegin);
  if (sentencebegin_local == (char *)0x0) {
    sentencebegin_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(sentencebegin);
    pcVar2 = strstr(sentencebegin_local + sVar1,"\r\n");
    if (pcVar2 == (char *)0x0) {
      sentencebegin_local = (char *)0x0;
    }
  }
  return sentencebegin_local;
}

Assistant:

inline char* FindRazorAHRSSentence(char* sentencebegin, char* str)
{
	char* ptr = NULL;
	char* foundstr = NULL;

	ptr = strstr(str, sentencebegin);
	if (!ptr)
	{
		// Could not find the beginning of the sentence.
		return NULL;
	}

	// Save the position of the beginning of the sentence.
	foundstr = ptr;

	// Check if the sentence is complete.
	ptr = strstr(foundstr+strlen(sentencebegin), "\r\n");
	if (!ptr)
	{
		// The sentence is incomplete.
		return NULL;
	}

	return foundstr;
}